

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op(DisasContext *s1,int op,MemOp ot,int d)

{
  TCGContext *tcg_ctx_00;
  uc_struct_conflict *uc_00;
  _Bool _Var1;
  bool bVar2;
  list_item *local_50;
  list_item *cur_1;
  hook *hook_1;
  list_item *cur;
  hook *hook;
  uc_struct *uc;
  TCGContext *tcg_ctx;
  int d_local;
  MemOp ot_local;
  int op_local;
  DisasContext *s1_local;
  
  tcg_ctx_00 = s1->uc->tcg_ctx;
  uc_00 = s1->uc;
  if (d == 0x10) {
    if ((s1->prefix & 4U) == 0) {
      gen_op_ld_v(s1,ot,s1->T0,s1->A0);
    }
  }
  else {
    if ((s1->prefix & 4U) != 0) {
      gen_illegal_opcode(s1);
      return;
    }
    gen_op_mov_v_reg(s1,ot,s1->T0,d);
  }
  switch(op) {
  case 0:
    if ((s1->prefix & 4U) == 0) {
      tcg_gen_add_i64(tcg_ctx_00,s1->T0,s1->T0,s1->T1);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_atomic_add_fetch_i64_x86_64(tcg_ctx_00,s1->T0,s1->A0,s1->T1,(long)s1->mem_index,ot);
    }
    gen_op_update2_cc(s1);
    set_cc_op(s1,ot + MO_LESL);
    break;
  case 1:
    if ((s1->prefix & 4U) == 0) {
      tcg_gen_or_i64_x86_64(tcg_ctx_00,s1->T0,s1->T0,s1->T1);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_atomic_or_fetch_i64_x86_64(tcg_ctx_00,s1->T0,s1->A0,s1->T1,(long)s1->mem_index,ot);
    }
    gen_op_update1_cc(s1);
    set_cc_op(s1,ot + (MO_ALIGN_2|MO_LESL));
    break;
  case 2:
    gen_compute_eflags_c(s1,s1->tmp4);
    if ((s1->prefix & 4U) == 0) {
      tcg_gen_add_i64(tcg_ctx_00,s1->T0,s1->T0,s1->T1);
      tcg_gen_add_i64(tcg_ctx_00,s1->T0,s1->T0,s1->tmp4);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_add_i64(tcg_ctx_00,s1->T0,s1->tmp4,s1->T1);
      tcg_gen_atomic_add_fetch_i64_x86_64(tcg_ctx_00,s1->T0,s1->A0,s1->T0,(long)s1->mem_index,ot);
    }
    gen_op_update3_cc(s1,s1->tmp4);
    set_cc_op(s1,ot + MO_BEUL);
    break;
  case 3:
    gen_compute_eflags_c(s1,s1->tmp4);
    if ((s1->prefix & 4U) == 0) {
      tcg_gen_sub_i64(tcg_ctx_00,s1->T0,s1->T0,s1->T1);
      tcg_gen_sub_i64(tcg_ctx_00,s1->T0,s1->T0,s1->tmp4);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_add_i64(tcg_ctx_00,s1->T0,s1->T1,s1->tmp4);
      tcg_gen_neg_i64(tcg_ctx_00,s1->T0,s1->T0);
      tcg_gen_atomic_add_fetch_i64_x86_64(tcg_ctx_00,s1->T0,s1->A0,s1->T0,(long)s1->mem_index,ot);
    }
    gen_op_update3_cc(s1,s1->tmp4);
    set_cc_op(s1,ot + (MO_ALIGN_2|MO_32));
    break;
  default:
    if ((s1->prefix & 4U) == 0) {
      tcg_gen_and_i64_x86_64(tcg_ctx_00,s1->T0,s1->T0,s1->T1);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_atomic_and_fetch_i64_x86_64(tcg_ctx_00,s1->T0,s1->A0,s1->T1,(long)s1->mem_index,ot);
    }
    gen_op_update1_cc(s1);
    set_cc_op(s1,ot + (MO_ALIGN_2|MO_LESL));
    break;
  case 5:
    if ((s1->prefix & 4U) == 0) {
      tcg_gen_mov_i64_x86_64(tcg_ctx_00,s1->cc_srcT,s1->T0);
      tcg_gen_sub_i64(tcg_ctx_00,s1->T0,s1->T0,s1->T1);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_neg_i64(tcg_ctx_00,s1->T0,s1->T1);
      tcg_gen_atomic_fetch_add_i64_x86_64
                (tcg_ctx_00,s1->cc_srcT,s1->A0,s1->T0,(long)s1->mem_index,ot);
      tcg_gen_sub_i64(tcg_ctx_00,s1->T0,s1->cc_srcT,s1->T1);
    }
    _Var1 = _hook_exists_bounded(uc_00->hook[0x10].head,s1->pc_start);
    if (_Var1) {
      hook_1 = (hook *)uc_00->hook[0x10].head;
      while( true ) {
        bVar2 = false;
        if (hook_1 != (hook *)0x0) {
          cur = *(list_item **)&hook_1->refs;
          bVar2 = cur != (list_item *)0x0;
        }
        if (!bVar2) break;
        if (((((ulong)cur[1].next & 0x100000000) == 0) && (*(int *)((long)&cur->data + 4) == 0)) &&
           (((ulong)cur[1].next & 2) != 0)) {
          gen_uc_traceopcode(tcg_ctx_00,cur,s1->T0,s1->T1,1 << ((byte)ot & 3) + 3,uc_00,s1->pc_start
                            );
        }
        hook_1 = *(hook **)hook_1;
      }
    }
    gen_op_update2_cc(s1);
    set_cc_op(s1,ot + MO_BESL);
    break;
  case 6:
    if ((s1->prefix & 4U) == 0) {
      tcg_gen_xor_i64_x86_64(tcg_ctx_00,s1->T0,s1->T0,s1->T1);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_atomic_xor_fetch_i64_x86_64(tcg_ctx_00,s1->T0,s1->A0,s1->T1,(long)s1->mem_index,ot);
    }
    gen_op_update1_cc(s1);
    set_cc_op(s1,ot + (MO_ALIGN_2|MO_LESL));
    break;
  case 7:
    tcg_gen_mov_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_cc_src,s1->T1);
    tcg_gen_mov_i64_x86_64(tcg_ctx_00,s1->cc_srcT,s1->T0);
    tcg_gen_sub_i64(tcg_ctx_00,tcg_ctx_00->cpu_cc_dst,s1->T0,s1->T1);
    _Var1 = _hook_exists_bounded(uc_00->hook[0x10].head,s1->pc_start);
    if (_Var1) {
      local_50 = uc_00->hook[0x10].head;
      while( true ) {
        bVar2 = false;
        if (local_50 != (list_item *)0x0) {
          cur_1 = (list_item *)local_50->data;
          bVar2 = cur_1 != (list_item *)0x0;
        }
        if (!bVar2) break;
        if (((((ulong)cur_1[1].next & 0x100000000) == 0) && (*(int *)((long)&cur_1->data + 4) == 0))
           && (((ulong)cur_1[1].next & 1) != 0)) {
          gen_uc_traceopcode(tcg_ctx_00,cur_1,s1->T0,s1->T1,1 << ((byte)ot & 3) + 3,uc_00,
                             s1->pc_start);
        }
        local_50 = local_50->next;
      }
    }
    set_cc_op(s1,ot + MO_BESL);
  }
  return;
}

Assistant:

static void gen_op(DisasContext *s1, int op, MemOp ot, int d)
{
    TCGContext *tcg_ctx = s1->uc->tcg_ctx;
    uc_engine *uc = s1->uc;

    if (d != OR_TMP0) {
        if (s1->prefix & PREFIX_LOCK) {
            /* Lock prefix when destination is not memory.  */
            gen_illegal_opcode(s1);
            return;
        }
        gen_op_mov_v_reg(s1, ot, s1->T0, d);
    } else if (!(s1->prefix & PREFIX_LOCK)) {
        gen_op_ld_v(s1, ot, s1->T0, s1->A0);
    }
    switch(op) {
    case OP_ADCL:
        gen_compute_eflags_c(s1, s1->tmp4);
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->tmp4, s1->T1);
            tcg_gen_atomic_add_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T0,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->T0, s1->tmp4);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update3_cc(s1, s1->tmp4);
        set_cc_op(s1, CC_OP_ADCB + ot);
        break;
    case OP_SBBL:
        gen_compute_eflags_c(s1, s1->tmp4);
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->T1, s1->tmp4);
            tcg_gen_neg_tl(tcg_ctx, s1->T0, s1->T0);
            tcg_gen_atomic_add_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T0,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_sub_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            tcg_gen_sub_tl(tcg_ctx, s1->T0, s1->T0, s1->tmp4);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update3_cc(s1, s1->tmp4);
        set_cc_op(s1, CC_OP_SBBB + ot);
        break;
    case OP_ADDL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_atomic_add_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T1,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update2_cc(s1);
        set_cc_op(s1, CC_OP_ADDB + ot);
        break;
    case OP_SUBL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_neg_tl(tcg_ctx, s1->T0, s1->T1);
            tcg_gen_atomic_fetch_add_tl(tcg_ctx, s1->cc_srcT, s1->A0, s1->T0,
                                        s1->mem_index, ot | MO_LE);
            tcg_gen_sub_tl(tcg_ctx, s1->T0, s1->cc_srcT, s1->T1);
        } else {
            tcg_gen_mov_tl(tcg_ctx, s1->cc_srcT, s1->T0);
            tcg_gen_sub_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, s1->pc_start)) {
            struct hook *hook;
            HOOK_FOREACH_VAR_DECLARE;
            HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
                if (hook->to_delete)
                    continue;
                if (hook->op == UC_TCG_OP_SUB && (hook->op_flags & UC_TCG_OP_FLAG_DIRECT) ) {
                    // TCGv is just an offset to tcg_ctx so it's safe to do so.
                    gen_uc_traceopcode(tcg_ctx, hook, (TCGv_i64)s1->T0, (TCGv_i64)s1->T1, 1 << ((ot & MO_SIZE) + 3), uc, s1->pc_start);
                }
            }
        }

        gen_op_update2_cc(s1);
        set_cc_op(s1, CC_OP_SUBB + ot);
        break;
    default:
    case OP_ANDL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_atomic_and_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T1,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_and_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update1_cc(s1);
        set_cc_op(s1, CC_OP_LOGICB + ot);
        break;
    case OP_ORL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_atomic_or_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T1,
                                       s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_or_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update1_cc(s1);
        set_cc_op(s1, CC_OP_LOGICB + ot);
        break;
    case OP_XORL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_atomic_xor_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T1,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_xor_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update1_cc(s1);
        set_cc_op(s1, CC_OP_LOGICB + ot);
        break;
    case OP_CMPL:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, s1->T1);
        tcg_gen_mov_tl(tcg_ctx, s1->cc_srcT, s1->T0);
        tcg_gen_sub_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, s1->T0, s1->T1);

        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, s1->pc_start)) {
            struct hook *hook;
            HOOK_FOREACH_VAR_DECLARE;
            HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
                if (hook->to_delete)
                    continue;
                if (hook->op == UC_TCG_OP_SUB && (hook->op_flags & UC_TCG_OP_FLAG_CMP) ) {
                    // TCGv is just an offset to tcg_ctx so it's safe to do so.
                    gen_uc_traceopcode(tcg_ctx, hook, (TCGv_i64)s1->T0, (TCGv_i64)s1->T1, 1 << ((ot & MO_SIZE) + 3), uc, s1->pc_start);
                }
            }
        }

        set_cc_op(s1, CC_OP_SUBB + ot);
        break;
    }
}